

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Font.cpp
# Opt level: O1

bool __thiscall sf::Font::loadFromMemory(Font *this,void *data,size_t sizeInBytes)

{
  int iVar1;
  int *piVar2;
  ostream *poVar3;
  size_t sVar4;
  long lVar5;
  char *pcVar6;
  FT_Face_conflict face;
  FT_Stroker stroker;
  FT_Library library;
  void *local_50;
  void *local_48;
  void *local_40;
  undefined1 *local_38;
  undefined8 local_30;
  undefined1 local_28 [16];
  
  cleanup(this,(EVP_PKEY_CTX *)data);
  piVar2 = (int *)operator_new(4);
  *piVar2 = 1;
  this->m_refCount = piVar2;
  iVar1 = FT_Init_FreeType(&local_40);
  if (iVar1 == 0) {
    this->m_library = local_40;
    iVar1 = FT_New_Memory_Face(local_40,data,sizeInBytes,0,&local_50);
    if (iVar1 == 0) {
      iVar1 = FT_Stroker_New(this->m_library,&local_48);
      if (iVar1 == 0) {
        iVar1 = FT_Select_Charmap(local_50,0x756e6963);
        if (iVar1 == 0) {
          this->m_stroker = local_48;
          this->m_face = local_50;
          pcVar6 = *(char **)((long)local_50 + 0x28);
          local_38 = local_28;
          if (pcVar6 == (char *)0x0) {
            local_30 = 0;
            local_28[0] = 0;
          }
          else {
            sVar4 = strlen(pcVar6);
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_38,pcVar6,pcVar6 + sVar4);
          }
          std::__cxx11::string::operator=((string *)&this->m_info,(string *)&local_38);
          if (local_38 != local_28) {
            operator_delete(local_38);
          }
          return true;
        }
        poVar3 = err();
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar3,
                   "Failed to load font from memory (failed to set the Unicode character set)",0x49)
        ;
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
        std::ostream::put((char)poVar3);
        std::ostream::flush();
        FT_Stroker_Done(local_48);
      }
      else {
        poVar3 = err();
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar3,"Failed to load font from memory (failed to create the stroker)",0x3e);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
        std::ostream::put((char)poVar3);
        std::ostream::flush();
      }
      FT_Done_Face(local_50);
      return false;
    }
    poVar3 = err();
    pcVar6 = "Failed to load font from memory (failed to create the font face)";
    lVar5 = 0x40;
  }
  else {
    poVar3 = err();
    pcVar6 = "Failed to load font from memory (failed to initialize FreeType)";
    lVar5 = 0x3f;
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,pcVar6,lVar5);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  return false;
}

Assistant:

bool Font::loadFromMemory(const void* data, std::size_t sizeInBytes)
{
    // Cleanup the previous resources
    cleanup();
    m_refCount = new int(1);

    // Initialize FreeType
    // Note: we initialize FreeType for every font instance in order to avoid having a single
    // global manager that would create a lot of issues regarding creation and destruction order.
    FT_Library library;
    if (FT_Init_FreeType(&library) != 0)
    {
        err() << "Failed to load font from memory (failed to initialize FreeType)" << std::endl;
        return false;
    }
    m_library = library;

    // Load the new font face from the specified file
    FT_Face face;
    if (FT_New_Memory_Face(static_cast<FT_Library>(m_library), reinterpret_cast<const FT_Byte*>(data), static_cast<FT_Long>(sizeInBytes), 0, &face) != 0)
    {
        err() << "Failed to load font from memory (failed to create the font face)" << std::endl;
        return false;
    }

    // Load the stroker that will be used to outline the font
    FT_Stroker stroker;
    if (FT_Stroker_New(static_cast<FT_Library>(m_library), &stroker) != 0)
    {
        err() << "Failed to load font from memory (failed to create the stroker)" << std::endl;
        FT_Done_Face(face);
        return false;
    }

    // Select the Unicode character map
    if (FT_Select_Charmap(face, FT_ENCODING_UNICODE) != 0)
    {
        err() << "Failed to load font from memory (failed to set the Unicode character set)" << std::endl;
        FT_Stroker_Done(stroker);
        FT_Done_Face(face);
        return false;
    }

    // Store the loaded font in our ugly void* :)
    m_stroker = stroker;
    m_face = face;

    // Store the font information
    m_info.family = face->family_name ? face->family_name : std::string();

    return true;
}